

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamReaderPrivate::LoadReferenceData(BamReaderPrivate *this)

{
  char *data;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  BgzfStream *this_00;
  char buffer [4];
  RefData aReference;
  undefined4 local_95;
  allocator local_91;
  BamReaderPrivate *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  value_type local_68;
  BgzfStream *local_40;
  RefVector *local_38;
  
  this_00 = &this->m_stream;
  BgzfStream::Read(this_00,(char *)&local_95,4);
  uVar2 = local_95 >> 0x18 | (local_95 & 0xff0000) >> 8 | (local_95 & 0xff00) << 8 |
          local_95 << 0x18;
  if (this->m_isBigEndian == false) {
    uVar2 = local_95;
  }
  local_38 = &this->m_references;
  local_90 = this;
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::reserve
            (local_38,(long)(int)uVar2);
  if (uVar2 != 0) {
    local_40 = this_00;
    do {
      BgzfStream::Read(this_00,(char *)&local_95,4);
      uVar1 = local_95 >> 0x18 | (local_95 & 0xff0000) >> 8 | (local_95 & 0xff00) << 8 |
              local_95 << 0x18;
      if (local_90->m_isBigEndian == false) {
        uVar1 = local_95;
      }
      __n = (ulong)uVar1;
      data = (char *)operator_new__(__n);
      memset(data,0,__n);
      BgzfStream::Read(this_00,data,__n);
      BgzfStream::Read(this_00,(char *)&local_95,4);
      uVar3 = local_95 >> 8 & 0xff;
      uVar1 = local_95 >> 0x10 & 0xff;
      if (local_90->m_isBigEndian == true) {
        uVar1 = (int)local_95._3_1_ | uVar1 << 8 | (local_95 & 0xff) << 0x18 | uVar3 << 0x10;
      }
      else {
        uVar1 = uVar3 << 8 | uVar1 << 0x10 | (int)local_95._3_1_ << 0x18 | local_95 & 0xff;
      }
      local_80 = 0;
      local_78[0] = 0;
      local_68.RefName._M_dataplus._M_p = (pointer)&local_68.RefName.field_2;
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_78,local_78);
      local_68.RefLength = 0;
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      std::__cxx11::string::string((string *)&local_88,data,&local_91);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      local_68.RefLength = uVar1;
      std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::push_back
                (local_38,&local_68);
      this_00 = local_40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.RefName._M_dataplus._M_p != &local_68.RefName.field_2) {
        operator_delete(local_68.RefName._M_dataplus._M_p);
      }
      operator_delete__(data);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return true;
}

Assistant:

bool BamReaderPrivate::LoadReferenceData()
{

    // get number of reference sequences
    char buffer[sizeof(uint32_t)];
    m_stream.Read(buffer, sizeof(uint32_t));
    uint32_t numberRefSeqs = BamTools::UnpackUnsignedInt(buffer);
    if (m_isBigEndian) BamTools::SwapEndian_32(numberRefSeqs);
    m_references.reserve((int)numberRefSeqs);

    // iterate over all references in header
    for (unsigned int i = 0; i != numberRefSeqs; ++i) {

        // get length of reference name
        m_stream.Read(buffer, sizeof(uint32_t));
        uint32_t refNameLength = BamTools::UnpackUnsignedInt(buffer);
        if (m_isBigEndian) BamTools::SwapEndian_32(refNameLength);
        RaiiBuffer refName(refNameLength);

        // get reference name and reference sequence length
        m_stream.Read(refName.Buffer, refNameLength);
        m_stream.Read(buffer, sizeof(int32_t));
        int32_t refLength = BamTools::UnpackSignedInt(buffer);
        if (m_isBigEndian) BamTools::SwapEndian_32(refLength);

        // store data for reference
        RefData aReference;
        aReference.RefName = static_cast<std::string>((const char*)refName.Buffer);
        aReference.RefLength = refLength;
        m_references.push_back(aReference);
    }

    // return success
    return true;
}